

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O2

Matrix3f * operator*(Matrix3f *__return_storage_ptr__,Matrix3f *m,float f)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Matrix3f *pMVar4;
  int i;
  long lVar5;
  long lVar6;
  Matrix3f *product;
  
  pMVar4 = __return_storage_ptr__;
  __return_storage_ptr__->m_elements[8] = m->m_elements[8];
  uVar1 = *(undefined8 *)m->m_elements;
  uVar2 = *(undefined8 *)(m->m_elements + 2);
  uVar3 = *(undefined8 *)(m->m_elements + 6);
  *(undefined8 *)(__return_storage_ptr__->m_elements + 4) = *(undefined8 *)(m->m_elements + 4);
  *(undefined8 *)(__return_storage_ptr__->m_elements + 6) = uVar3;
  *(undefined8 *)__return_storage_ptr__->m_elements = uVar1;
  *(undefined8 *)(__return_storage_ptr__->m_elements + 2) = uVar2;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    for (lVar6 = 0; lVar6 != 0x24; lVar6 = lVar6 + 0xc) {
      *(float *)((long)__return_storage_ptr__ + lVar6) =
           *(float *)((long)__return_storage_ptr__ + lVar6) * f;
    }
    __return_storage_ptr__ = (Matrix3f *)((long)__return_storage_ptr__ + 4);
  }
  return pMVar4;
}

Assistant:

Matrix3f operator * (const Matrix3f& m, float f) {
    Matrix3f product(m); // zeroes

    for (int i = 0; i < 3; ++i)
    {
        for (int j = 0; j < 3; ++j)
        {
            product(i, j) *= f;
        }
    }
    return product;
}